

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_group_ops(ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  int *piVar6;
  long *plVar7;
  ulong uVar8;
  int iVar9;
  Layer *pLVar10;
  long lVar11;
  size_t sVar12;
  int iVar13;
  void *in_R8;
  int i;
  uint uVar14;
  long lVar15;
  void *pvVar16;
  Allocator *pAVar17;
  Allocator *pAVar18;
  int i_00;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Mat local_288;
  undefined1 auStack_23c [8];
  int local_234;
  uint local_230;
  int local_22c;
  Mat local_228;
  Allocator *local_1e0;
  int *piStack_1d8;
  size_t local_1d0;
  uint local_1c8;
  Allocator *local_1c0;
  undefined8 local_1b8;
  ulong uStack_1b0;
  uint local_1a8;
  size_t local_1a0;
  Allocator *local_198;
  int *piStack_190;
  size_t local_188;
  uint local_180;
  Allocator *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  uint local_160;
  size_t local_158;
  void *local_150;
  int *piStack_148;
  size_t sStack_140;
  int iStack_138;
  Allocator *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined8 local_110;
  void *local_108;
  int *piStack_100;
  size_t sStack_f8;
  int iStack_f0;
  Allocator *local_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined8 local_c8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c0;
  size_t local_b8;
  Allocator *local_b0;
  Mat local_a8;
  size_t local_60;
  Option *local_58;
  Mat *local_50;
  size_t local_48;
  ParamDict pd;
  
  iVar9 = (this->super_ConvolutionDepthWise).num_output;
  iVar13 = (this->super_ConvolutionDepthWise).kernel_h * (this->super_ConvolutionDepthWise).kernel_w
  ;
  iVar2 = (this->super_ConvolutionDepthWise).group;
  uVar8 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar2;
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)iVar13;
  local_c0 = &this->group_ops;
  lVar15 = 0;
  local_58 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar15) break;
    if (ppLVar4[lVar15] != (Layer *)0x0) {
      (*ppLVar4[lVar15]->_vptr_Layer[1])();
    }
    lVar15 = lVar15 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar3 = (this->super_ConvolutionDepthWise).group;
  i_00 = (this->super_ConvolutionDepthWise).num_output / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c0,(long)iVar3);
  local_22c = (((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                     (long)(iVar9 / iVar2)) * iVar2) / iVar3) * iVar13 * i_00;
  local_48 = (size_t)local_22c;
  local_60 = (size_t)i_00;
  local_50 = &(this->super_ConvolutionDepthWise).activation_params;
  for (lVar15 = 0; lVar15 < (this->super_ConvolutionDepthWise).group; lVar15 = lVar15 + 1) {
    local_228.elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
    local_228.data =
         (void *)(lVar15 * local_48 * local_228.elemsize +
                 (long)(this->super_ConvolutionDepthWise).weight_data.data);
    local_228.elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
    local_228.allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
    local_228.refcount = (int *)0x0;
    local_228.c = 1;
    local_228.w = (int)local_48;
    local_228.dims = 1;
    local_228.h = 1;
    local_228.d = 1;
    local_228.cstep = local_48;
    Mat::clone(&local_a8,(__fn *)&local_228,(void *)0x0,1,in_R8);
    if (local_228.refcount != (int *)0x0) {
      LOCK();
      *local_228.refcount = *local_228.refcount + -1;
      UNLOCK();
      if (*local_228.refcount == 0) {
        if (local_228.allocator == (Allocator *)0x0) {
          free(local_228.data);
        }
        else {
          (*(local_228.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    bVar19 = (this->super_ConvolutionDepthWise).bias_term == 0;
    if (bVar19) {
      pAVar18 = (Allocator *)0x0;
      sVar12 = 0;
      local_230 = 0;
      local_b0 = (Allocator *)0x0;
      local_234 = 0;
      local_b8 = 0;
    }
    else {
      sVar12 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
      pAVar18 = (Allocator *)
                (lVar15 * local_60 * sVar12 +
                (long)(this->super_ConvolutionDepthWise).bias_data.data);
      local_230 = (this->super_ConvolutionDepthWise).bias_data.elempack;
      local_b0 = (this->super_ConvolutionDepthWise).bias_data.allocator;
      local_b8 = local_60;
      local_234 = i_00;
    }
    bVar19 = !bVar19;
    uVar14 = (uint)bVar19;
    pLVar10 = create_layer_cpu(6);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,(this->super_ConvolutionDepthWise).kernel_w);
    ParamDict::set(&pd,0xb,(this->super_ConvolutionDepthWise).kernel_h);
    ParamDict::set(&pd,2,(this->super_ConvolutionDepthWise).dilation_w);
    ParamDict::set(&pd,0xc,(this->super_ConvolutionDepthWise).dilation_h);
    ParamDict::set(&pd,3,(this->super_ConvolutionDepthWise).stride_w);
    ParamDict::set(&pd,0xd,(this->super_ConvolutionDepthWise).stride_h);
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,5,(this->super_ConvolutionDepthWise).bias_term);
    ParamDict::set(&pd,6,local_22c);
    ParamDict::set(&pd,8,(this->super_ConvolutionDepthWise).int8_scale_term);
    ParamDict::set(&pd,9,(this->super_ConvolutionDepthWise).activation_type);
    ParamDict::set(&pd,10,local_50);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    if ((this->super_ConvolutionDepthWise).bias_term == 0) {
      lVar11 = 0x40;
      auVar21._0_12_ = ZEXT812(0);
      auVar21._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_228.data + lVar11) = 0;
        *(undefined1 (*) [16])((long)&local_288.allocator + lVar11) = auVar21;
        *(undefined1 (*) [16])((long)&local_288.w + lVar11) = auVar21;
        *(undefined1 (*) [16])((long)&local_288.cstep + lVar11) = auVar21;
        *(undefined1 (*) [16])(auStack_23c + lVar11) = auVar21;
        lVar11 = lVar11 + 0x48;
      } while (lVar11 != 0x160);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.data = local_a8.data;
      local_228.refcount = local_a8.refcount;
      local_228.elemsize = local_a8.elemsize;
      local_228.elempack = local_a8.elempack;
      local_228.allocator = local_a8.allocator;
      local_228.dims = local_a8.dims;
      local_228.w = local_a8.w;
      local_228.h = local_a8.h;
      local_228.d = local_a8.d;
      local_228.c = local_a8.c;
      local_228.cstep = local_a8.cstep;
      if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
        local_288.cstep = 0;
        local_288.data = (Allocator *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elempack = 0;
        local_288.elemsize._4_4_ = (int)local_288.refcount;
        local_288.allocator = (Allocator *)local_288.data;
        local_288.dims = (int)local_288.refcount;
        local_288.w = local_288.elempack;
        local_288.h = (int)local_288.elemsize;
        local_288.d = (int)local_288.refcount;
        local_288.c = local_288.elempack;
        Mat::create(&local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data + lVar15 * 4
                 );
        iVar9 = local_288.c * (int)local_288.cstep;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        for (lVar11 = 0; iVar9 != (int)lVar11; lVar11 = lVar11 + 1) {
          *(undefined4 *)((long)(_func_int ***)local_288.data + lVar11 * 4) = uVar1;
        }
        piVar6 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        if (piStack_1d8 != (int *)0x0) {
          LOCK();
          *piStack_1d8 = *piStack_1d8 + -1;
          UNLOCK();
          if (*piStack_1d8 == 0) {
            if (local_1c0 == (Allocator *)0x0) {
              free(local_1e0);
            }
            else {
              (*local_1c0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1d8 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_1e0 = (Allocator *)local_288.data;
        local_1d0 = CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize);
        local_1c8 = local_288.elempack;
        local_1c0 = local_288.allocator;
        local_1b8 = CONCAT44(local_288.w,local_288.dims);
        uStack_1b0 = CONCAT44(local_288.d,local_288.h);
        local_1a8 = local_288.c;
        local_1a0 = local_288.cstep;
        sVar12 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
        pAVar17 = (Allocator *)
                  (sVar12 * lVar15 +
                  (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
        uVar14 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
        pAVar18 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
        if (piStack_190 != (int *)0x0) {
          LOCK();
          *piStack_190 = *piStack_190 + -1;
          UNLOCK();
          if (*piStack_190 == 0) {
            if (local_178 == (Allocator *)0x0) {
              free(local_198);
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
        piStack_190 = (int *)0x0;
        local_170 = 0x100000001;
        uStack_168 = 0x100000001;
        local_160 = 1;
        local_158 = 1;
        piVar6 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_198 = pAVar17;
        local_188 = sVar12;
        local_180 = uVar14;
        local_178 = pAVar18;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              free(local_288.data);
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar12 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar16 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar9 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar18 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_148 != (int *)0x0) {
            LOCK();
            *piStack_148 = *piStack_148 + -1;
            UNLOCK();
            if (*piStack_148 == 0) {
              if (local_130 == (Allocator *)0x0) {
                free(local_150);
              }
              else {
                (*local_130->_vptr_Allocator[3])();
              }
            }
          }
          piStack_148 = (int *)0x0;
          local_128 = 1;
          uStack_124 = 1;
          uStack_120 = 1;
          uStack_11c = 1;
          local_118 = 1;
          local_110 = 1;
          local_150 = (void *)(sVar12 * lVar15 + (long)pvVar16);
          sStack_140 = sVar12;
          iStack_138 = iVar9;
          local_130 = pAVar18;
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
      lVar11 = 0xd8;
      do {
        piVar6 = *(int **)((long)&local_228.refcount + lVar11);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            plVar7 = *(long **)((long)&local_228.allocator + lVar11);
            if (plVar7 == (long *)0x0) {
              free(*(void **)((long)&local_228.data + lVar11));
            }
            else {
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_228.cstep + lVar11) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_228.elemsize + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_228.data + lVar11) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar11) = 0;
        *(undefined4 *)((long)&local_228.c + lVar11) = 0;
        *(undefined8 *)((long)&local_228.dims + lVar11) = 0;
        *(undefined8 *)((long)&local_228.h + lVar11) = 0;
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != -0x48);
    }
    else {
      lVar11 = 0x40;
      auVar20._0_12_ = ZEXT812(0);
      auVar20._12_4_ = 0;
      do {
        *(undefined8 *)((long)&local_228.data + lVar11) = 0;
        *(undefined1 (*) [16])((long)&local_288.allocator + lVar11) = auVar20;
        *(undefined1 (*) [16])((long)&local_288.w + lVar11) = auVar20;
        *(undefined1 (*) [16])((long)&local_288.cstep + lVar11) = auVar20;
        *(undefined1 (*) [16])(auStack_23c + lVar11) = auVar20;
        lVar11 = lVar11 + 0x48;
      } while (lVar11 != 0x1a8);
      if (local_a8.refcount != (int *)0x0) {
        LOCK();
        *local_a8.refcount = *local_a8.refcount + 1;
        UNLOCK();
      }
      if (local_228.refcount != (int *)0x0) {
        LOCK();
        *local_228.refcount = *local_228.refcount + -1;
        UNLOCK();
        if (*local_228.refcount == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.data = local_a8.data;
      local_228.refcount = local_a8.refcount;
      local_228.elemsize = local_a8.elemsize;
      local_228.elempack = local_a8.elempack;
      local_228.allocator = local_a8.allocator;
      local_228.dims = local_a8.dims;
      local_228.w = local_a8.w;
      local_228.h = local_a8.h;
      local_228.d = local_a8.d;
      local_228.c = local_a8.c;
      local_228.cstep = local_a8.cstep;
      if (piStack_1d8 != (int *)0x0) {
        LOCK();
        *piStack_1d8 = *piStack_1d8 + -1;
        UNLOCK();
        if (*piStack_1d8 == 0) {
          if (local_1c0 == (Allocator *)0x0) {
            free(local_1e0);
          }
          else {
            (*local_1c0->_vptr_Allocator[3])();
          }
        }
      }
      piStack_1d8 = (int *)0x0;
      local_1c8 = local_230;
      local_1c0 = local_b0;
      local_1b8 = CONCAT44(local_234,uVar14);
      uStack_1b0 = (ulong)CONCAT14(bVar19,uVar14);
      local_1a0 = local_b8;
      local_1e0 = pAVar18;
      local_1d0 = sVar12;
      local_1a8 = uVar14;
      if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
        local_288.cstep = 0;
        local_288.data = (Allocator *)0x0;
        local_288.refcount._0_4_ = 0;
        local_288.refcount._4_4_ = 0;
        local_288.elemsize._0_4_ = 0;
        local_288.elemsize._4_4_ = 0;
        local_288.elempack = 0;
        local_288.h = 0;
        local_288.d = 0;
        local_288.c = 0;
        local_288.allocator = (Allocator *)0x0;
        local_288.dims = 0;
        local_288.w = 0;
        Mat::create(&local_288,i_00,4,(Allocator *)0x0);
        uVar1 = *(undefined4 *)
                 ((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data + lVar15 * 4
                 );
        iVar9 = local_288.c * (int)local_288.cstep;
        if (iVar9 < 1) {
          iVar9 = 0;
        }
        for (lVar11 = 0; iVar9 != (int)lVar11; lVar11 = lVar11 + 1) {
          *(undefined4 *)((long)(_func_int ***)local_288.data + lVar11 * 4) = uVar1;
        }
        piVar6 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        if (piStack_190 != (int *)0x0) {
          LOCK();
          *piStack_190 = *piStack_190 + -1;
          UNLOCK();
          if (*piStack_190 == 0) {
            if (local_178 == (Allocator *)0x0) {
              free(local_198);
            }
            else {
              (*local_178->_vptr_Allocator[3])();
            }
          }
        }
        piStack_190 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_198 = (Allocator *)local_288.data;
        local_188 = CONCAT44(local_288.elemsize._4_4_,(int)local_288.elemsize);
        local_180 = local_288.elempack;
        local_178 = local_288.allocator;
        local_170 = CONCAT44(local_288.w,local_288.dims);
        uStack_168 = CONCAT44(local_288.d,local_288.h);
        local_160 = local_288.c;
        local_158 = local_288.cstep;
        sVar12 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
        pvVar16 = (void *)(sVar12 * lVar15 +
                          (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
        iVar9 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elempack;
        pAVar18 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
        if (piStack_148 != (int *)0x0) {
          LOCK();
          *piStack_148 = *piStack_148 + -1;
          UNLOCK();
          if (*piStack_148 == 0) {
            if (local_130 == (Allocator *)0x0) {
              free(local_150);
            }
            else {
              (*local_130->_vptr_Allocator[3])();
            }
          }
        }
        piStack_148 = (int *)0x0;
        local_128 = 1;
        uStack_124 = 1;
        uStack_120 = 1;
        uStack_11c = 1;
        local_118 = 1;
        local_110 = 1;
        piVar6 = (int *)CONCAT44(local_288.refcount._4_4_,(int)local_288.refcount);
        local_150 = pvVar16;
        sStack_140 = sVar12;
        iStack_138 = iVar9;
        local_130 = pAVar18;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_288.allocator == (Allocator *)0x0) {
              free(local_288.data);
            }
            else {
              (*(local_288.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (100 < (this->super_ConvolutionDepthWise).int8_scale_term) {
          sVar12 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elemsize;
          pvVar16 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
          iVar9 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.elempack;
          pAVar18 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.allocator;
          if (piStack_100 != (int *)0x0) {
            LOCK();
            *piStack_100 = *piStack_100 + -1;
            UNLOCK();
            if (*piStack_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                free(local_108);
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          piStack_100 = (int *)0x0;
          local_e0 = 1;
          uStack_dc = 1;
          uStack_d8 = 1;
          uStack_d4 = 1;
          local_d0 = 1;
          local_c8 = 1;
          local_108 = (void *)(sVar12 * lVar15 + (long)pvVar16);
          sStack_f8 = sVar12;
          iStack_f0 = iVar9;
          local_e8 = pAVar18;
        }
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_228);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_288);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
      lVar11 = 0x120;
      do {
        piVar6 = *(int **)((long)&local_228.refcount + lVar11);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            plVar7 = *(long **)((long)&local_228.allocator + lVar11);
            if (plVar7 == (long *)0x0) {
              free(*(void **)((long)&local_228.data + lVar11));
            }
            else {
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_228.cstep + lVar11) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_228.elemsize + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_228.data + lVar11) = 0;
        *(undefined8 *)((long)&local_228.refcount + lVar11) = 0;
        *(undefined4 *)((long)&local_228.c + lVar11) = 0;
        *(undefined8 *)((long)&local_228.dims + lVar11) = 0;
        *(undefined8 *)((long)&local_228.h + lVar11) = 0;
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != -0x48);
    }
    (*pLVar10->_vptr_Layer[4])(pLVar10,local_58);
    (local_c0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar15] = pLVar10;
    ParamDict::~ParamDict(&pd);
    if (local_a8.refcount != (int *)0x0) {
      LOCK();
      *local_a8.refcount = *local_a8.refcount + -1;
      UNLOCK();
      if (*local_a8.refcount == 0) {
        if (local_a8.allocator == (Allocator *)0x0) {
          free(local_a8.data);
        }
        else {
          (*(local_a8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}